

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<int,_JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<int>
          (BaseDictionary<int,_JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int *key,int *i,int *last,uint *targetBucket)

{
  int iVar1;
  SimpleDictionaryEntry<int,_Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>_>
  *pSVar2;
  uint uVar3;
  int *piVar4;
  
  piVar4 = (this->buckets).ptr;
  if (piVar4 == (int *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = GetBucket(this,*key * 2 + 1);
    *targetBucket = uVar3;
    *last = -1;
    pSVar2 = (this->entries).ptr;
    piVar4 = piVar4 + *targetBucket;
    uVar3 = 0;
    while( true ) {
      iVar1 = *piVar4;
      *i = iVar1;
      if ((long)iVar1 < 0) break;
      if (pSVar2[iVar1].
          super_DefaultHashedEntry<int,_Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .
          super_KeyValueEntry<int,_Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>_>
          .
          super_ValueEntry<Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>_>_>
          .
          super_KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>_>
          .key == *key) {
        if (this->stats == (DictionaryStats *)0x0) {
          return true;
        }
        DictionaryStats::Lookup(this->stats,uVar3);
        return true;
      }
      uVar3 = uVar3 + 1;
      *last = iVar1;
      piVar4 = &pSVar2[*i].
                super_DefaultHashedEntry<int,_Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .
                super_KeyValueEntry<int,_Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>_>
                .
                super_ValueEntry<Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>_>_>
                .
                super_KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_>_>
                .next;
    }
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,uVar3);
  }
  return false;
}

Assistant:

inline bool FindEntryWithKey(const LookupType& key, int *const i, int *const last, uint *const targetBucket)
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                *targetBucket = this->GetBucket(hashCode);
                *last = -1;
                EntryType * localEntries = entries;
                for (*i = localBuckets[*targetBucket]; *i >= 0; *last = *i, *i = localEntries[*i].next)
                {
                    if (localEntries[*i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return true;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }
#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return false;
        }